

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

void * rw::ps2::destroyNativeData(void *object,int32 param_2,int32 param_3)

{
  int *piVar1;
  long lVar2;
  uint32 i;
  ulong uVar3;
  
  piVar1 = *(int **)((long)object + 0x98);
  if ((piVar1 != (int *)0x0) && (*piVar1 == 4)) {
    lVar2 = 8;
    uVar3 = 0;
    while( true ) {
      if ((uint)piVar1[1] <= uVar3) break;
      (*DAT_00145dd0)(*(undefined8 *)(*(long *)(piVar1 + 2) + lVar2));
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    }
    (*DAT_00145dd0)();
    (*DAT_00145dd0)(piVar1);
    *(undefined8 *)((long)object + 0x98) = 0;
  }
  return object;
}

Assistant:

void*
destroyNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_PS2)
		return object;
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	for(uint32 i = 0; i < header->numMeshes; i++)
		rwFree(header->instanceMeshes[i].dataRaw);
	rwFree(header->instanceMeshes);
	rwFree(header);
	geometry->instData = nil;
	return object;
}